

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitfield.h
# Opt level: O2

void __thiscall
ClownLZSS::Internal::BitField::
WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
::Push(WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
       *this,bool bit)

{
  undefined3 in_register_00000031;
  anon_class_8_1_8991fb9c local_18;
  
  local_18.this = this;
  Push::anon_class_8_1_8991fb9c::operator()(&local_18);
  this->bits = (ulong)CONCAT31(in_register_00000031,bit) + this->bits * 2;
  this->bits_remaining = this->bits_remaining - 1;
  return;
}

Assistant:

void Push(const bool bit)
				{
					const auto &CheckWriteBits = [&]()
					{
						if (bits_remaining == 0)
						{
							WriteBits();
						}
					};

					if constexpr(write_when == WriteWhen::BeforePush)
						CheckWriteBits();

					if constexpr(push_where == PushWhere::High)
					{
						bits >>= 1;
						bits |= bit << (total_bits - 1);
					}
					else //if constexpr(push_where == PushWhere::Low)
					{
						bits <<= 1;
						bits |= bit;
					}

					--bits_remaining;

					if constexpr(write_when == WriteWhen::AfterPush)
						CheckWriteBits();
				}